

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearrayview.h
# Opt level: O1

bool comparesEqual(QByteArrayView *lhs,QByteArrayView *rhs)

{
  size_t __n;
  int iVar1;
  
  __n = lhs->m_size;
  if (__n != rhs->m_size) {
    return false;
  }
  if (__n != 0) {
    iVar1 = bcmp(lhs->m_data,rhs->m_data,__n);
    return iVar1 == 0;
  }
  return true;
}

Assistant:

[[nodiscard]] constexpr const_pointer data() const noexcept { return m_data; }